

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.h
# Opt level: O1

int __thiscall KMPNativeAffinity::Mask::begin(Mask *this)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = (*(this->super_Mask)._vptr_Mask[0xb])();
  uVar2 = 0;
  if (0 < iVar1) {
    do {
      iVar1 = (*(this->super_Mask)._vptr_Mask[3])(this,(ulong)uVar2);
      if ((char)iVar1 != '\0') {
        return uVar2;
      }
      uVar2 = uVar2 + 1;
      iVar1 = (*(this->super_Mask)._vptr_Mask[0xb])(this);
    } while ((int)uVar2 < iVar1);
  }
  return uVar2;
}

Assistant:

int begin() const override {
      int retval = 0;
      while (retval < end() && !is_set(retval))
        ++retval;
      return retval;
    }